

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1.c
# Opt level: O3

void ssh1_channel_check_close(ssh1_channel *c)

{
  ssh1_connection_state *psVar1;
  Channel *pCVar2;
  _Bool _Var3;
  PktOut *pPVar4;
  uint uVar5;
  
  if (c->halfopen != false) {
    return;
  }
  psVar1 = c->connlayer;
  uVar5 = c->closes;
  if ((~uVar5 & 5) != 0) {
    _Var3 = (*c->chan->vt->want_close)(c->chan,(_Bool)((byte)uVar5 & 1),SUB41((uVar5 & 4) >> 2,0));
    uVar5 = c->closes;
    if (!_Var3) goto LAB_00120b35;
  }
  if ((uVar5 & 2) == 0) {
    if ((uVar5 & 1) == 0) {
      pPVar4 = (*((psVar1->ppl).bpp)->vt->new_pktout)(0x18);
      BinarySink_put_uint32(pPVar4->binarysink_,(ulong)c->remoteid);
      pq_base_push(&((psVar1->ppl).out_pq)->pqb,&pPVar4->qnode);
      uVar5 = c->closes | 1;
      c->closes = uVar5;
    }
    if ((uVar5 & 4) != 0) {
      pPVar4 = (*((psVar1->ppl).bpp)->vt->new_pktout)(0x19);
      BinarySink_put_uint32(pPVar4->binarysink_,(ulong)c->remoteid);
      pq_base_push(&((psVar1->ppl).out_pq)->pqb,&pPVar4->qnode);
      uVar5 = c->closes | 2;
      c->closes = uVar5;
    }
  }
LAB_00120b35:
  if ((~uVar5 & 10) != 0) {
    return;
  }
  psVar1 = c->connlayer;
  ssh1_channel_close_local(c,(char *)0x0);
  del234(psVar1->channels,c);
  pCVar2 = c->chan;
  if (pCVar2 != (Channel *)0x0) {
    (*pCVar2->vt->free)(pCVar2);
  }
  safefree(c);
  queue_toplevel_callback(ssh1_check_termination_callback,psVar1);
  return;
}

Assistant:

static void ssh1_channel_check_close(struct ssh1_channel *c)
{
    struct ssh1_connection_state *s = c->connlayer;
    PktOut *pktout;

    if (c->halfopen) {
        /*
         * If we've sent out our own CHANNEL_OPEN but not yet seen
         * either OPEN_CONFIRMATION or OPEN_FAILURE in response, then
         * it's too early to be sending close messages of any kind.
         */
        return;
    }

    if ((!((CLOSES_SENT_CLOSE | CLOSES_RCVD_CLOSE) & ~c->closes) ||
         chan_want_close(c->chan, (c->closes & CLOSES_SENT_CLOSE),
                         (c->closes & CLOSES_RCVD_CLOSE))) &&
        !(c->closes & CLOSES_SENT_CLOSECONF)) {
        /*
         * We have both sent and received CLOSE (or the channel type
         * doesn't need us to), which means the channel is in final
         * wind-up. Send CLOSE and/or CLOSE_CONFIRMATION, whichever we
         * haven't sent yet.
         */
        if (!(c->closes & CLOSES_SENT_CLOSE)) {
            pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH1_MSG_CHANNEL_CLOSE);
            put_uint32(pktout, c->remoteid);
            pq_push(s->ppl.out_pq, pktout);
            c->closes |= CLOSES_SENT_CLOSE;
        }
        if (c->closes & CLOSES_RCVD_CLOSE) {
            pktout = ssh_bpp_new_pktout(
                s->ppl.bpp, SSH1_MSG_CHANNEL_CLOSE_CONFIRMATION);
            put_uint32(pktout, c->remoteid);
            pq_push(s->ppl.out_pq, pktout);
            c->closes |= CLOSES_SENT_CLOSECONF;
        }
    }

    if (!((CLOSES_SENT_CLOSECONF | CLOSES_RCVD_CLOSECONF) & ~c->closes)) {
        /*
         * We have both sent and received CLOSE_CONFIRMATION, which
         * means we're completely done with the channel.
         */
        ssh1_channel_destroy(c);
    }
}